

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statement.cpp
# Opt level: O0

void __thiscall cs::statement_if::run_impl(statement_if *this)

{
  bool bVar1;
  bool *pbVar2;
  element_type *peVar3;
  long in_RDI;
  exception *e;
  exception *e_1;
  statement_base **ptr;
  iterator __end2;
  iterator __begin2;
  deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *__range2;
  scope_guard scope;
  undefined1 in_stack_000007ff;
  iterator *in_stack_00000800;
  runtime_type *in_stack_00000808;
  _Self *in_stack_fffffffffffffeb8;
  _Self *in_stack_fffffffffffffec0;
  any *in_stack_ffffffffffffff40;
  _Deque_iterator<cs::statement_base_*,_cs::statement_base_*&,_cs::statement_base_**> local_58;
  long local_38;
  tree_node *local_18;
  
  std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x1dceb5);
  std::__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x1dcec1);
  local_18 = (tree_node *)
             tree_type<cs::token_base_*>::root
                       ((tree_type<cs::token_base_*> *)in_stack_fffffffffffffeb8);
  runtime_type::parse_expr(in_stack_00000808,in_stack_00000800,(bool)in_stack_000007ff);
  pbVar2 = cs_impl::any::const_val<bool>(in_stack_ffffffffffffff40);
  bVar1 = *pbVar2;
  cs_impl::any::~any((any *)0x1dcf26);
  if ((bVar1 & 1U) != 0) {
    scope_guard::scope_guard
              ((scope_guard *)in_stack_fffffffffffffec0,(context_t *)in_stack_fffffffffffffeb8);
    local_38 = in_RDI + 0x28;
    std::deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::begin
              ((deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)
               in_stack_fffffffffffffeb8);
    std::deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::end
              ((deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)
               in_stack_fffffffffffffeb8);
    while (bVar1 = std::operator!=(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8), bVar1) {
      std::_Deque_iterator<cs::statement_base_*,_cs::statement_base_*&,_cs::statement_base_**>::
      operator*(&local_58);
      statement_base::run((statement_base *)in_stack_fffffffffffffec0);
      std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x1dd26e);
      peVar3 = std::__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x1dd27a);
      if ((peVar3->return_fcall & 1U) != 0) break;
      std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x1dd291);
      peVar3 = std::__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x1dd29d);
      if ((peVar3->break_block & 1U) != 0) break;
      std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x1dd2b4);
      peVar3 = std::__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x1dd2c0);
      if ((peVar3->continue_block & 1U) != 0) break;
      std::_Deque_iterator<cs::statement_base_*,_cs::statement_base_*&,_cs::statement_base_**>::
      operator++(in_stack_fffffffffffffec0);
    }
    scope_guard::~scope_guard((scope_guard *)0x1dd2ec);
  }
  return;
}

Assistant:

void statement_if::run_impl()
	{
		CS_DEBUGGER_STEP(this);
		if (context->instance->parse_expr(mTree.root()).const_val<boolean>()) {
			scope_guard scope(context);
			for (auto &ptr: mBlock) {
				try {
					ptr->run();
				}
				catch (const cs::exception &e) {
					throw e;
				}
				catch (const std::exception &e) {
					throw exception(ptr->get_line_num(), ptr->get_file_path(), ptr->get_raw_code(), e.what());
				}
				if (context->instance->return_fcall || context->instance->break_block ||
				        context->instance->continue_block)
					break;
			}
		}
	}